

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getDigits(char *zDate,char *zFormat,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *puVar3;
  undefined8 in_R8;
  int iVar4;
  undefined8 in_R9;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 auStack_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ulong local_48;
  undefined8 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_38 = (undefined1 *)auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0x3000000010;
  puStack_40 = (undefined8 *)&stack0x00000008;
  iVar2 = 0;
  do {
    cVar1 = zFormat[3];
    iVar4 = 0;
    for (lVar6 = 0; (byte)(*zFormat - 0x30U) != (byte)lVar6; lVar6 = lVar6 + 1) {
      if ((ulong)(byte)zDate[lVar6] - 0x3a < 0xfffffffffffffff6) goto LAB_001a0ec4;
      iVar4 = iVar4 * 10 + (int)zDate[lVar6] + -0x30;
    }
    if (((iVar4 < (char)(zFormat[1] + -0x30)) ||
        ((int)(uint)(ushort)yy_reduce_ofst[(long)zFormat[2] + 0x14d] < iVar4)) ||
       ((cVar1 != '\0' && (cVar1 != zDate[(byte)(*zFormat - 0x30U)])))) break;
    uVar5 = local_48 & 0xffffffff;
    if (uVar5 < 0x29) {
      local_48 = CONCAT44(local_48._4_4_,(int)local_48 + 8);
      puVar3 = (undefined8 *)((long)auStack_f8 + uVar5);
    }
    else {
      puVar3 = puStack_40;
      puStack_40 = puStack_40 + 1;
    }
    zDate = zDate + (byte)(*zFormat - 0x30U) + 1;
    iVar2 = iVar2 + 1;
    zFormat = zFormat + 4;
    *(int *)*puVar3 = iVar4;
  } while (cVar1 != '\0');
LAB_001a0ec4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  auStack_f8[2] = in_RDX;
  auStack_f8[3] = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  __stack_chk_fail();
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e      f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 14712 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}